

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv_fs_mkdir(uv_loop_t *loop,uv_fs_t *req,char *path,int mode,uv_fs_cb cb)

{
  long *plVar1;
  void *pvVar2;
  int iVar3;
  char *pcVar4;
  
  req->type = UV_FS;
  if (cb != (uv_fs_cb)0x0) {
    req->active_queue[0] = loop->active_reqs;
    plVar1 = (long *)loop->active_reqs[1];
    req->active_queue[1] = plVar1;
    *plVar1 = (long)req->active_queue;
    loop->active_reqs[1] = req->active_queue;
  }
  req->fs_type = UV_FS_MKDIR;
  req->result = 0;
  req->ptr = (void *)0x0;
  req->loop = loop;
  req->path = (char *)0x0;
  req->new_path = (char *)0x0;
  req->cb = cb;
  if (path != (char *)0x0) {
    if (cb == (uv_fs_cb)0x0) {
      req->path = path;
      req->mode = mode;
      uv__fs_work(&req->work_req);
      iVar3 = (int)req->result;
    }
    else {
      pcVar4 = uv__strdup(path);
      req->path = pcVar4;
      if (pcVar4 == (char *)0x0) {
        if (loop->active_reqs == (void **)loop->active_reqs[0]) {
          pcVar4 = "uv__has_active_reqs(loop)";
          goto LAB_0053aecd;
        }
        pvVar2 = req->active_queue[0];
        *(void **)req->active_queue[1] = pvVar2;
        *(void **)((long)pvVar2 + 8) = req->active_queue[1];
        iVar3 = -0xc;
      }
      else {
        req->mode = mode;
        uv__work_submit(loop,&req->work_req,uv__fs_work,uv__fs_done);
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  pcVar4 = "path != NULL";
LAB_0053aecd:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/fs.c"
                ,0x486,"int uv_fs_mkdir(uv_loop_t *, uv_fs_t *, const char *, int, uv_fs_cb)");
}

Assistant:

int uv_fs_mkdir(uv_loop_t* loop,
                uv_fs_t* req,
                const char* path,
                int mode,
                uv_fs_cb cb) {
  INIT(MKDIR);
  PATH;
  req->mode = mode;
  POST;
}